

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall
absl::lts_20240722::Cord::InlineRep::AppendTreeToTree
          (InlineRep *this,Nonnull<CordRep_*> tree,MethodIdentifier method)

{
  CordzUpdateScope CVar1;
  Nonnull<CordRepBtree_*> pCVar2;
  CordRepBtree *pCVar3;
  Nonnull<CordRep_*> pCVar4;
  CordzUpdateScope scope;
  CordzUpdateScope local_20;
  
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0xda,
                  "void absl::Cord::InlineRep::AppendTreeToTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  local_20.info_ = cord_internal::InlineData::cordz_info(&this->data_);
  if (local_20.info_ != (CordzInfo *)0x0) {
    absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_20.info_);
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x272,"CordRep *absl::cord_internal::InlineData::as_tree() const");
  }
  pCVar2 = ForceBtree((this->data_).rep_.field_0.as_tree.rep);
  if (tree == (Nonnull<CordRep_*>)0x0) {
    __assert_fail("edge != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                  ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
  }
  if (tree->tag < 5) {
    pCVar4 = tree;
    if (tree->tag == 1) {
      pCVar4 = *(Nonnull<CordRep_*> *)&tree[1].refcount;
    }
    if (pCVar4->tag < 5) {
      pCVar3 = (CordRepBtree *)
               absl::lts_20240722::cord_internal::CordRepBtree::AppendSlow(pCVar2,tree);
      goto LAB_0010b6a1;
    }
  }
  pCVar3 = absl::lts_20240722::cord_internal::CordRepBtree::
           AddCordRep<(absl::lts_20240722::cord_internal::CordRepBtree::EdgeType)1>(pCVar2,tree);
LAB_0010b6a1:
  CVar1.info_ = local_20.info_;
  if (pCVar3 == (CordRepBtree *)0x0) {
    __assert_fail("rep",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                  ,0x500,
                  "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
    (this->data_).rep_.field_0.as_tree.rep = &pCVar3->super_CordRep;
    if (local_20.info_ != (CordzInfo *)0x0) {
      absl::lts_20240722::Mutex::AssertHeld();
      *(CordRepBtree **)(CVar1.info_ + 0x40) = pCVar3;
    }
    cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_20);
    return;
  }
  __assert_fail("data_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                ,0x501,
                "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
               );
}

Assistant:

void Cord::InlineRep::AppendTreeToTree(absl::Nonnull<CordRep*> tree,
                                       MethodIdentifier method) {
  assert(is_tree());
  const CordzUpdateScope scope(data_.cordz_info(), method);
  tree = CordRepBtree::Append(ForceBtree(data_.as_tree()), tree);
  SetTree(tree, scope);
}